

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O2

void __thiscall
agge::tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>::operator()
          (thread_mapping_blender<unsigned_short,_unsigned_char> *this,unsigned_short *pixels,
          int param_2,int param_3,count_t length,cover_type *covers)

{
  byte bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  mutex *this_01;
  pointer puVar2;
  thread_id tVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t i;
  ulong uVar6;
  bool bVar7;
  ushort local_54;
  thread_id local_38;
  
  do {
    bVar7 = length == 0;
    length = length - 1;
    if (bVar7) {
      return;
    }
    bVar1 = *covers;
    this_00 = this->_mapping;
    this_01 = this->_mtx;
    tVar3 = this_thread_id();
    local_38 = tVar3;
    mutex::lock(this_01);
    puVar2 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    uVar6 = 0;
    while( true ) {
      uVar4 = (uint)uVar6;
      if ((ulong)((long)uVar5 >> 3) <= uVar6) break;
      if (tVar3 == puVar2[uVar6]) goto LAB_00187551;
      uVar6 = (ulong)(byte)((char)uVar6 + 1);
    }
    uVar4 = (uint)(uVar5 >> 3) & 0x1fffffff;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&local_38);
LAB_00187551:
    mutex::unlock(this_01);
    local_54 = (ushort)bVar1;
    *pixels = local_54 | (ushort)((uVar4 & 0xff) << 8);
    pixels = pixels + 1;
    covers = covers + 1;
  } while( true );
}

Assistant:

void operator ()(PixelT *pixels, int /*x*/, int /*y*/, count_t length, const cover_type *covers) const
				{
					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ (map_thread(_mapping, _mtx) << sizeof(cover_type) * 8));
				}